

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

int h2_process_pending_input(Curl_cfilter *cf,Curl_easy *data,CURLcode *err)

{
  bufq *q;
  undefined8 *puVar1;
  _Bool _Var2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  size_t blen;
  uchar *buf;
  size_t local_48;
  uint8_t *local_40;
  CURLcode *local_38;
  
  puVar1 = (undefined8 *)cf->ctx;
  q = (bufq *)(puVar1 + 3);
  local_38 = err;
  _Var2 = Curl_bufq_peek(q,&local_40,&local_48);
  if (_Var2) {
    do {
      sVar4 = nghttp2_session_mem_recv((nghttp2_session *)*puVar1,local_40,local_48);
      if ((long)sVar4 < 0) {
        pcVar5 = nghttp2_strerror((int)sVar4);
        Curl_failf(data,"process_pending_input: nghttp2_session_mem_recv() returned %zd:%s",sVar4,
                   pcVar5);
        *local_38 = CURLE_RECV_ERROR;
        return -1;
      }
      Curl_bufq_skip(q,sVar4);
      _Var2 = Curl_bufq_is_empty(q);
      if (_Var2) break;
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
         (0 < cf->cft->log_level)) {
        sVar4 = Curl_bufq_len(q);
        Curl_trc_cf_infof(data,cf,"process_pending_input: %zu bytes left in connection buffer",sVar4
                         );
      }
      _Var2 = Curl_bufq_peek(q,&local_40,&local_48);
    } while (_Var2);
  }
  iVar3 = nghttp2_session_check_request_allowed((nghttp2_session *)*puVar1);
  if (iVar3 == 0) {
    Curl_conncontrol(cf->conn,1);
  }
  return 0;
}

Assistant:

static int h2_process_pending_input(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    CURLcode *err)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  const unsigned char *buf;
  size_t blen;
  ssize_t rv;

  while(Curl_bufq_peek(&ctx->inbufq, &buf, &blen)) {

    rv = nghttp2_session_mem_recv(ctx->h2, (const uint8_t *)buf, blen);
    if(rv < 0) {
      failf(data,
            "process_pending_input: nghttp2_session_mem_recv() returned "
            "%zd:%s", rv, nghttp2_strerror((int)rv));
      *err = CURLE_RECV_ERROR;
      return -1;
    }
    Curl_bufq_skip(&ctx->inbufq, (size_t)rv);
    if(Curl_bufq_is_empty(&ctx->inbufq)) {
      break;
    }
    else {
      CURL_TRC_CF(data, cf, "process_pending_input: %zu bytes left "
                  "in connection buffer", Curl_bufq_len(&ctx->inbufq));
    }
  }

  if(nghttp2_session_check_request_allowed(ctx->h2) == 0) {
    /* No more requests are allowed in the current session, so
       the connection may not be reused. This is set when a
       GOAWAY frame has been received or when the limit of stream
       identifiers has been reached. */
    connclose(cf->conn, "http/2: No new requests allowed");
  }

  return 0;
}